

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
           *this)

{
  CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *alloc;
  char *pcVar1;
  byte *pbVar2;
  ctrl_t *pcVar3;
  proxy *ppVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined8 uVar21;
  int iVar22;
  ctrl_t *pcVar23;
  undefined4 extraout_var;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  size_t i;
  FindInfo FVar29;
  type raw;
  slot_type local_40;
  ulong uVar24;
  
  uVar24 = this->capacity_;
  if ((uVar24 == 0) || ((uVar24 + 1 & uVar24) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                 );
  }
  if (uVar24 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                 );
  }
  pcVar3 = this->ctrl_;
  if (pcVar3[uVar24] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar23 = pcVar3 + uVar24;
  if (pcVar23 + 1 != pcVar3) {
    uVar27 = 0;
    do {
      pcVar1 = pcVar3 + uVar27;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar3 + uVar27);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      uVar27 = uVar27 + 0x10;
    } while (uVar24 + 1 != uVar27);
  }
  uVar21 = *(undefined8 *)(pcVar3 + 8);
  *(undefined8 *)(pcVar23 + 1) = *(undefined8 *)pcVar3;
  *(undefined8 *)(pcVar23 + 9) = uVar21;
  *pcVar23 = -1;
  sVar25 = this->capacity_;
  if (sVar25 != 0) {
    alloc = &this->settings_;
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        ppVar4 = this->slots_[i].value.first.mDat;
        if (ppVar4 == (proxy *)0x0) {
          uVar24 = 0;
        }
        else {
          iVar22 = (*ppVar4->data->_vptr_baseHolder[7])();
          uVar24 = CONCAT44(extraout_var,iVar22);
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar24;
        uVar27 = SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar29 = find_first_non_full(this,uVar27);
        sVar25 = FVar29.offset;
        uVar24 = this->capacity_;
        if ((uVar24 + 1 & uVar24) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar26 = uVar27 >> 7 & uVar24;
        bVar28 = (byte)uVar27;
        if (((i - uVar26 ^ sVar25 - uVar26) & uVar24) < 0x10) {
          bVar28 = bVar28 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar25] == -2) {
            set_ctrl(this,sVar25,bVar28 & 0x7f);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,&local_40,
                       this->slots_ + i);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                       this->slots_ + i,this->slots_ + sVar25);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                       this->slots_ + sVar25,&local_40);
            i = i - 1;
            goto LAB_0021a5ef;
          }
          if (this->ctrl_[sVar25] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                         );
          }
          set_ctrl(this,sVar25,bVar28 & 0x7f);
          hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
          transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                    ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                     this->slots_ + sVar25,this->slots_ + i);
          bVar28 = 0x80;
        }
        set_ctrl(this,i,bVar28);
      }
LAB_0021a5ef:
      i = i + 1;
      sVar25 = this->capacity_;
    } while (i != sVar25);
  }
  reset_growth_left(this,sVar25);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}